

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lf_heter_queue.h
# Opt level: O2

bool __thiscall
density::
lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
::try_pop(lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
          *this)

{
  consume_operation operation;
  consume_operation local_20;
  
  try_start_consume(&local_20,this);
  if (0xf < local_20.m_consume_data.m_next_ptr) {
    consume_operation::commit(&local_20);
  }
  consume_operation::~consume_operation(&local_20);
  return 0xf < local_20.m_consume_data.m_next_ptr;
}

Assistant:

bool try_pop() noexcept
        {
            if (auto operation = try_start_consume())
            {
                operation.commit();
                return true;
            }
            return false;
        }